

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

MovInst __thiscall mocker::detail::MoveInfo::popWorklist(MoveInfo *this)

{
  reference psVar1;
  iterator __position;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  *this_00;
  MovInst MVar2;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> local_28;
  undefined1 local_19;
  MoveInfo *this_local;
  shared_ptr<mocker::nasm::Mov> *res;
  
  local_19 = 0;
  this_00 = (unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
             *)(in_RSI + 0xe0);
  this_local = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
       ::begin(this_00);
  psVar1 = std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Mov>,_true,_true>::operator*
                     ((_Node_iterator<std::shared_ptr<mocker::nasm::Mov>,_true,_true> *)&local_28);
  std::shared_ptr<mocker::nasm::Mov>::shared_ptr((shared_ptr<mocker::nasm::Mov> *)this,psVar1);
  __position = std::
               unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
               ::begin(this_00);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  ::erase(this_00,__position);
  MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MovInst)MVar2.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MovInst MoveInfo::popWorklist() {
  auto res = *worklist.begin();
  worklist.erase(worklist.begin());
  return res;
}